

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidateDataStructure.cpp
# Opt level: O1

void __thiscall
Assimp::ValidateDSProcess::DoValidationEx<aiLight>
          (ValidateDSProcess *this,aiLight **parray,uint size,char *firstName,char *secondName)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (size != 0) {
    if (parray == (aiLight **)0x0) {
      ReportError(this,"aiScene::%s is NULL (aiScene::%s is %i)",firstName,secondName,(ulong)size);
    }
    uVar6 = 1;
    uVar4 = 0;
    do {
      if (parray[uVar4] == (aiLight *)0x0) {
        pcVar5 = "aiScene::%s[%u] is NULL (aiScene::%s is %u)";
        uVar4 = uVar4 & 0xffffffff;
        uVar7 = (ulong)size;
LAB_0030a12d:
        ReportError(this,pcVar5,firstName,uVar4,secondName,uVar7);
      }
      Validate(this,parray[uVar4]);
      uVar1 = uVar4 + 1;
      if (uVar1 < size) {
        uVar2 = (parray[uVar4]->mName).length;
        pcVar5 = (parray[uVar4]->mName).data;
        uVar7 = uVar6;
        do {
          if (uVar2 == (parray[uVar7]->mName).length) {
            this = (ValidateDSProcess *)pcVar5;
            iVar3 = bcmp(pcVar5,(parray[uVar7]->mName).data,(ulong)uVar2);
            if (iVar3 == 0) {
              pcVar5 = "aiScene::%s[%u] has the same name as aiScene::%s[%u]";
              uVar7 = uVar7 & 0xffffffff;
              goto LAB_0030a12d;
            }
          }
          uVar7 = uVar7 + 1;
        } while (size != (uint)uVar7);
      }
      uVar6 = uVar6 + 1;
      uVar4 = uVar1;
    } while (uVar1 != size);
  }
  return;
}

Assistant:

inline void ValidateDSProcess::DoValidationEx(T** parray, unsigned int size,
    const char* firstName, const char* secondName)
{
    // validate all entries
    if (size)
    {
        if (!parray)    {
            ReportError("aiScene::%s is NULL (aiScene::%s is %i)",
                firstName, secondName, size);
        }
        for (unsigned int i = 0; i < size;++i)
        {
            if (!parray[i])
            {
                ReportError("aiScene::%s[%u] is NULL (aiScene::%s is %u)",
                    firstName,i,secondName,size);
            }
            Validate(parray[i]);

            // check whether there are duplicate names
            for (unsigned int a = i+1; a < size;++a)
            {
                if (parray[i]->mName == parray[a]->mName)
                {
                	ReportError("aiScene::%s[%u] has the same name as "
                        "aiScene::%s[%u]",firstName, i,secondName, a);
                }
            }
        }
    }
}